

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_truetype.h
# Opt level: O2

int stbtt__matchpair(stbtt_uint8 *fc,stbtt_uint32 nm,stbtt_uint8 *name,stbtt_int32 nlen,
                    stbtt_int32 target_id,stbtt_int32 next_id)

{
  int iVar1;
  uint uVar2;
  int iVar3;
  ushort uVar4;
  ulong uVar5;
  uint uVar6;
  ushort uVar7;
  ushort uVar8;
  ulong uVar9;
  
  uVar5 = (ulong)(ushort)(*(ushort *)(fc + (ulong)nm + 2) << 8 |
                         *(ushort *)(fc + (ulong)nm + 2) >> 8);
  iVar1 = (ushort)(*(ushort *)(fc + (ulong)nm + 4) << 8 | *(ushort *)(fc + (ulong)nm + 4) >> 8) + nm
  ;
  uVar6 = nm + 6;
  uVar9 = 1;
  do {
    if (uVar9 - uVar5 == 1) {
      return 0;
    }
    if ((uint)(ushort)(*(ushort *)(fc + (ulong)uVar6 + 6) << 8 |
                      *(ushort *)(fc + (ulong)uVar6 + 6) >> 8) == target_id) {
      uVar8 = *(ushort *)(fc + uVar6) << 8 | *(ushort *)(fc + uVar6) >> 8;
      uVar7 = *(ushort *)(fc + (ulong)uVar6 + 2) << 8 | *(ushort *)(fc + (ulong)uVar6 + 2) >> 8;
      uVar4 = *(ushort *)(fc + (ulong)uVar6 + 4);
      if (uVar8 != 0) {
        if ((uVar8 != 3) || (uVar7 != 1 && uVar7 != 10)) goto LAB_0010c5d9;
      }
      uVar2 = stbtt__CompareUTF8toUTF16_bigendian_prefix
                        (name,nlen,
                         fc + (ulong)(ushort)(*(ushort *)(fc + (ulong)uVar6 + 10) << 8 |
                                             *(ushort *)(fc + (ulong)uVar6 + 10) >> 8) + (long)iVar1
                         ,(uint)(ushort)(*(ushort *)(fc + (ulong)uVar6 + 8) << 8 |
                                        *(ushort *)(fc + (ulong)uVar6 + 8) >> 8));
      if (-1 < (int)uVar2) {
        if (((((uVar9 < uVar5) &&
              ((uint)(ushort)(*(ushort *)(fc + (ulong)uVar6 + 0x12) << 8 |
                             *(ushort *)(fc + (ulong)uVar6 + 0x12) >> 8) == next_id)) &&
             ((ushort)(*(ushort *)(fc + (ulong)uVar6 + 0xc) << 8 |
                      *(ushort *)(fc + (ulong)uVar6 + 0xc) >> 8) == uVar8)) &&
            (((ushort)(*(ushort *)(fc + (ulong)uVar6 + 0xe) << 8 |
                      *(ushort *)(fc + (ulong)uVar6 + 0xe) >> 8) == uVar7 &&
             ((ushort)(*(ushort *)(fc + (ulong)uVar6 + 0x10) << 8 |
                      *(ushort *)(fc + (ulong)uVar6 + 0x10) >> 8) ==
              (ushort)(uVar4 << 8 | uVar4 >> 8))))) &&
           (uVar4 = *(ushort *)(fc + (ulong)uVar6 + 0x14) << 8 |
                    *(ushort *)(fc + (ulong)uVar6 + 0x14) >> 8, uVar4 != 0)) {
          if ((((int)uVar2 < nlen) && (name[uVar2] == ' ')) &&
             (iVar3 = stbtt_CompareUTF8toUTF16_bigendian
                                ((char *)(name + (ulong)uVar2 + 1),~uVar2 + nlen,
                                 (char *)(fc + (ulong)(ushort)(*(ushort *)(fc + (ulong)uVar6 + 0x16)
                                                               << 8 | *(ushort *)
                                                                       (fc + (ulong)uVar6 + 0x16) >>
                                                                      8) + (long)iVar1),(uint)uVar4)
             , iVar3 != 0)) {
            return 1;
          }
        }
        else if (uVar2 == nlen) {
          return 1;
        }
      }
    }
LAB_0010c5d9:
    uVar6 = uVar6 + 0xc;
    uVar9 = uVar9 + 1;
  } while( true );
}

Assistant:

static int stbtt__matchpair(stbtt_uint8 *fc, stbtt_uint32 nm, stbtt_uint8 *name, stbtt_int32 nlen, stbtt_int32 target_id, stbtt_int32 next_id)
{
   stbtt_int32 i;
   stbtt_int32 count = ttUSHORT(fc+nm+2);
   stbtt_int32 stringOffset = nm + ttUSHORT(fc+nm+4);

   for (i=0; i < count; ++i) {
      stbtt_uint32 loc = nm + 6 + 12 * i;
      stbtt_int32 id = ttUSHORT(fc+loc+6);
      if (id == target_id) {
         // find the encoding
         stbtt_int32 platform = ttUSHORT(fc+loc+0), encoding = ttUSHORT(fc+loc+2), language = ttUSHORT(fc+loc+4);

         // is this a Unicode encoding?
         if (platform == 0 || (platform == 3 && encoding == 1) || (platform == 3 && encoding == 10)) {
            stbtt_int32 slen = ttUSHORT(fc+loc+8);
            stbtt_int32 off = ttUSHORT(fc+loc+10);

            // check if there's a prefix match
            stbtt_int32 matchlen = stbtt__CompareUTF8toUTF16_bigendian_prefix(name, nlen, fc+stringOffset+off,slen);
            if (matchlen >= 0) {
               // check for target_id+1 immediately following, with same encoding & language
               if (i+1 < count && ttUSHORT(fc+loc+12+6) == next_id && ttUSHORT(fc+loc+12) == platform && ttUSHORT(fc+loc+12+2) == encoding && ttUSHORT(fc+loc+12+4) == language) {
                  slen = ttUSHORT(fc+loc+12+8);
                  off = ttUSHORT(fc+loc+12+10);
                  if (slen == 0) {
                     if (matchlen == nlen)
                        return 1;
                  } else if (matchlen < nlen && name[matchlen] == ' ') {
                     ++matchlen;
                     if (stbtt_CompareUTF8toUTF16_bigendian((char*) (name+matchlen), nlen-matchlen, (char*)(fc+stringOffset+off),slen))
                        return 1;
                  }
               } else {
                  // if nothing immediately following
                  if (matchlen == nlen)
                     return 1;
               }
            }
         }

         // @TODO handle other encodings
      }
   }
   return 0;
}